

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpdec.c
# Opt level: O2

VP8StatusCode DecodeWebPIncremental(uint8_t *data,size_t data_size,WebPDecoderConfig *config)

{
  VP8StatusCode VVar1;
  WebPIDecoder *idec;
  
  if (config == (WebPDecoderConfig *)0x0) {
    VVar1 = VP8_STATUS_INVALID_PARAM;
  }
  else {
    PrintAnimationWarning(config);
    idec = WebPIDecode(data,data_size,config);
    if (idec == (WebPIDecoder *)0x0) {
      fwrite("Failed during WebPIDecode().\n",0x1d,1,_stderr);
      VVar1 = VP8_STATUS_OUT_OF_MEMORY;
    }
    else {
      VVar1 = WebPIUpdate(idec,data,data_size);
      WebPIDelete(idec);
    }
  }
  return VVar1;
}

Assistant:

VP8StatusCode DecodeWebPIncremental(
    const uint8_t* const data, size_t data_size,
    WebPDecoderConfig* const config) {
  VP8StatusCode status = VP8_STATUS_OK;
  if (config == NULL) return VP8_STATUS_INVALID_PARAM;

  PrintAnimationWarning(config);

  // Decoding call.
  {
    WebPIDecoder* const idec = WebPIDecode(data, data_size, config);
    if (idec == NULL) {
      fprintf(stderr, "Failed during WebPIDecode().\n");
      return VP8_STATUS_OUT_OF_MEMORY;
    } else {
      status = WebPIUpdate(idec, data, data_size);
      WebPIDelete(idec);
    }
  }
  return status;
}